

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaResolveAttrTypeReferences
              (xmlSchemaAttributePtr_conflict item,xmlSchemaParserCtxtPtr ctxt)

{
  xmlSchemaTypePtr pxVar1;
  xmlSchemaTypePtr type;
  xmlSchemaParserCtxtPtr ctxt_local;
  xmlSchemaAttributePtr_conflict item_local;
  
  if (((item->flags & 0x100U) == 0) &&
     (item->flags = item->flags | 0x100, item->subtypes == (xmlSchemaTypePtr)0x0)) {
    if (item->typeName == (xmlChar *)0x0) {
      pxVar1 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYSIMPLETYPE);
      item->subtypes = pxVar1;
    }
    else {
      pxVar1 = xmlSchemaGetType(ctxt->schema,item->typeName,item->typeNs);
      if ((pxVar1 == (xmlSchemaTypePtr)0x0) ||
         ((pxVar1->type != XML_SCHEMA_TYPE_SIMPLE &&
          ((pxVar1->type != XML_SCHEMA_TYPE_BASIC || (pxVar1->builtInType == 0x2d)))))) {
        xmlSchemaPResCompAttrErr
                  (ctxt,XML_SCHEMAP_SRC_RESOLVE,(xmlSchemaBasicItemPtr)item,item->node,"type",
                   item->typeName,item->typeNs,XML_SCHEMA_TYPE_SIMPLE,(char *)0x0);
        return ctxt->err;
      }
      item->subtypes = pxVar1;
    }
  }
  return 0;
}

Assistant:

static int
xmlSchemaResolveAttrTypeReferences(xmlSchemaAttributePtr item,
				   xmlSchemaParserCtxtPtr ctxt)
{
    /*
    * The simple type definition corresponding to the <simpleType> element
    * information item in the [children], if present, otherwise the simple
    * type definition `resolved` to by the `actual value` of the type
    * [attribute], if present, otherwise the `simple ur-type definition`.
    */
    if (item->flags & XML_SCHEMAS_ATTR_INTERNAL_RESOLVED)
	return(0);
    item->flags |= XML_SCHEMAS_ATTR_INTERNAL_RESOLVED;
    if (item->subtypes != NULL)
        return(0);
    if (item->typeName != NULL) {
        xmlSchemaTypePtr type;

	type = xmlSchemaGetType(ctxt->schema, item->typeName,
	    item->typeNs);
	if ((type == NULL) || (! WXS_IS_SIMPLE(type))) {
	    xmlSchemaPResCompAttrErr(ctxt,
		XML_SCHEMAP_SRC_RESOLVE,
		WXS_BASIC_CAST item, item->node,
		"type", item->typeName, item->typeNs,
		XML_SCHEMA_TYPE_SIMPLE, NULL);
	    return(ctxt->err);
	} else
	    item->subtypes = type;

    } else {
	/*
	* The type defaults to the xs:anySimpleType.
	*/
	item->subtypes = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYSIMPLETYPE);
    }
    return(0);
}